

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InvalidBinsSelectExpr * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidBinsSelectExpr,slang::ast::BinsSelectExpr_const*&>
          (BumpAllocator *this,BinsSelectExpr **args)

{
  InvalidBinsSelectExpr *child;
  InvalidBinsSelectExpr *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  child = (InvalidBinsSelectExpr *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  ast::InvalidBinsSelectExpr::InvalidBinsSelectExpr(in_RSI,(BinsSelectExpr *)child);
  return child;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }